

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_contour.cpp
# Opt level: O1

void __thiscall agg::vcgen_contour::vcgen_contour(vcgen_contour *this)

{
  (this->m_stroker).m_width = 0.5;
  (this->m_stroker).m_width_abs = 0.5;
  (this->m_stroker).m_width_eps = 0.00048828125;
  (this->m_stroker).m_width_sign = 1;
  (this->m_stroker).m_miter_limit = 4.0;
  (this->m_stroker).m_inner_miter_limit = 1.01;
  (this->m_stroker).m_approx_scale = 1.0;
  (this->m_stroker).m_line_cap = butt_cap;
  (this->m_stroker).m_line_join = miter_join;
  (this->m_stroker).m_inner_join = inner_miter;
  this->m_width = 1.0;
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks = (vertex_dist **)0x0;
  *(undefined8 *)&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_block_ptr_inc = 0
  ;
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size = 0;
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_num_blocks = 0;
  *(undefined8 *)&(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_max_blocks = 0;
  (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_block_ptr_inc = 0x40;
  (this->m_out_vertices).m_size = 0;
  (this->m_out_vertices).m_num_blocks = 0;
  (this->m_out_vertices).m_max_blocks = 0;
  (this->m_out_vertices).m_blocks = (point_base<double> **)0x0;
  (this->m_out_vertices).m_block_ptr_inc = 0x40;
  this->m_status = initial;
  this->m_src_vertex = 0;
  this->m_closed = 0;
  this->m_orientation = 0;
  this->m_auto_detect = false;
  return;
}

Assistant:

vcgen_contour::vcgen_contour() :
        m_stroker(),
        m_width(1),
        m_src_vertices(),
        m_out_vertices(),
        m_status(initial),
        m_src_vertex(0),
        m_closed(0),
        m_orientation(0),
        m_auto_detect(false)
    {
    }